

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v10::detail::
for_each_codepoint<fmt::v10::detail::compute_width(fmt::v10::basic_string_view<char>)::count_code_points>
          (detail *this,string_view s,count_code_points f)

{
  detail *buf_ptr;
  detail *pdVar1;
  char *pcVar2;
  detail *ptr;
  char *pcVar3;
  size_t __n;
  char buf [7];
  anon_class_8_1_54a39806 decode;
  char local_40 [8];
  anon_class_8_1_54a39806 local_38;
  
  local_38.f.count = (count_code_points)s.size_;
  pcVar3 = s.data_;
  ptr = this;
  if ((char *)0x3 < pcVar3) {
    pdVar1 = this;
    do {
      buf_ptr = pdVar1;
      ptr = buf_ptr;
      if (this + (long)pcVar3 + -3 <= buf_ptr) break;
      pdVar1 = (detail *)
               for_each_codepoint<count_code_points>::anon_class_8_1_54a39806::operator()
                         (&local_38,(char *)buf_ptr,(char *)buf_ptr);
      ptr = (detail *)0x0;
    } while (pdVar1 != (detail *)0x0);
    if (buf_ptr < this + (long)pcVar3 + -3) {
      return;
    }
  }
  __n = (long)(this + (long)pcVar3) - (long)ptr;
  if (__n != 0) {
    local_40[4] = '\0';
    local_40[5] = '\0';
    local_40[6] = '\0';
    local_40[0] = '\0';
    local_40[1] = '\0';
    local_40[2] = '\0';
    local_40[3] = '\0';
    if ((long)__n < 0) {
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Optiroc[P]SuperFamiconv/include/fmt/core.h"
                  ,0x189,"negative value");
    }
    if (this + (long)pcVar3 != ptr) {
      memcpy(local_40,ptr,__n);
    }
    pcVar3 = local_40;
    do {
      pcVar2 = for_each_codepoint<count_code_points>::anon_class_8_1_54a39806::operator()
                         (&local_38,pcVar3,(char *)ptr);
      if (pcVar2 == (char *)0x0) {
        return;
      }
      ptr = ptr + ((long)pcVar2 - (long)pcVar3);
      pcVar3 = pcVar2;
    } while ((long)pcVar2 - (long)local_40 < (long)__n);
  }
  return;
}

Assistant:

FMT_CONSTEXPR void for_each_codepoint(string_view s, F f) {
  auto decode = [f](const char* buf_ptr, const char* ptr) {
    auto cp = uint32_t();
    auto error = 0;
    auto end = utf8_decode(buf_ptr, &cp, &error);
    bool result = f(error ? invalid_code_point : cp,
                    string_view(ptr, error ? 1 : to_unsigned(end - buf_ptr)));
    return result ? (error ? buf_ptr + 1 : end) : nullptr;
  };
  auto p = s.data();
  const size_t block_size = 4;  // utf8_decode always reads blocks of 4 chars.
  if (s.size() >= block_size) {
    for (auto end = p + s.size() - block_size + 1; p < end;) {
      p = decode(p, p);
      if (!p) return;
    }
  }
  if (auto num_chars_left = s.data() + s.size() - p) {
    char buf[2 * block_size - 1] = {};
    copy_str<char>(p, p + num_chars_left, buf);
    const char* buf_ptr = buf;
    do {
      auto end = decode(buf_ptr, p);
      if (!end) return;
      p += end - buf_ptr;
      buf_ptr = end;
    } while (buf_ptr - buf < num_chars_left);
  }
}